

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dws.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *str,string *delim)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (str->_M_string_length != 0) {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (uVar2 < str->_M_string_length) {
        do {
          lVar1 = std::__cxx11::string::find
                            ((char)delim,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar2]);
          uVar3 = uVar2;
          if (lVar1 == -1) break;
          uVar2 = uVar2 + 1;
          uVar3 = uVar2;
        } while (uVar2 < str->_M_string_length);
      }
      uVar2 = uVar3;
      if (uVar3 < str->_M_string_length) {
        do {
          lVar1 = std::__cxx11::string::find
                            ((char)delim,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar2]);
          if (lVar1 != -1) break;
          uVar2 = uVar2 + 1;
        } while (uVar2 < str->_M_string_length);
      }
      if (uVar2 - uVar3 != 0) {
        std::__cxx11::string::string((string *)&local_50,(string *)str,uVar3,uVar2 - uVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    } while (uVar2 < str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> split(const string& str, const string& delim)
{
	vector<string> parts;
	size_t start;
	size_t end = 0;
	while (end < str.size())
	{
		start = end;
		while (start < str.size() && (delim.find(str[start]) != string::npos))
			start++; // skip initial whitespace
		end = start;
		while (end < str.size() && (delim.find(str[end]) == string::npos))
			end++; // skip to end of word
		if (end - start != 0) // just ignore zero-length strings.
			parts.push_back(string(str, start, end - start));
	}
	return parts;
}